

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::BVH::query(BVH *this,AABB *queryAabb,Array<unsigned_int> *result)

{
  int iVar1;
  uint8_t *puVar2;
  bool bVar3;
  char *__function;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t todo [64];
  ulong local_150;
  uint local_138 [66];
  
  (result->m_base).size = 0;
  local_138[0] = 0;
  uVar4 = 0;
  do {
    uVar5 = local_138[uVar4];
    uVar6 = (ulong)uVar5;
    uVar7 = (this->m_nodes).m_base.size;
    if (uVar7 <= uVar5) goto LAB_001aba57;
    local_150 = (ulong)((int)uVar4 - 1);
    puVar2 = (this->m_nodes).m_base.buffer;
    iVar1 = *(int *)(puVar2 + uVar6 * 0x24 + 0x20);
    if (iVar1 == 0) {
      if (*(int *)(puVar2 + uVar6 * 0x24 + 0x1c) != 0) {
        uVar5 = 0;
        do {
          uVar7 = *(int *)(puVar2 + uVar6 * 0x24 + 0x18) + uVar5;
          if ((this->m_objectIds).m_base.size <= uVar7) {
LAB_001aba29:
            __function = 
            "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
            ;
            goto LAB_001aba6c;
          }
          uVar8 = *(uint *)((this->m_objectIds).m_base.buffer + (ulong)uVar7 * 4);
          if ((this->m_objectAabbs->m_base).size <= uVar8) {
            __function = 
            "const T &xatlas::internal::Array<xatlas::internal::AABB>::operator[](uint32_t) const [T = xatlas::internal::AABB]"
            ;
            goto LAB_001aba6c;
          }
          bVar3 = AABB::intersect(queryAabb,
                                  (AABB *)((this->m_objectAabbs->m_base).buffer +
                                          (ulong)uVar8 * 0x18));
          if (bVar3) {
            if ((this->m_objectIds).m_base.size <= uVar7) goto LAB_001aba29;
            ArrayBase::push_back
                      (&result->m_base,(this->m_objectIds).m_base.buffer + (ulong)uVar7 * 4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < *(uint *)(puVar2 + uVar6 * 0x24 + 0x1c));
      }
    }
    else {
      uVar8 = uVar5 + 1;
      if (uVar7 <= uVar8) {
LAB_001aba57:
        __function = 
        "const T &xatlas::internal::Array<xatlas::internal::BVH::Node>::operator[](uint32_t) const [T = xatlas::internal::BVH::Node]"
        ;
LAB_001aba6c:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4a8,__function);
      }
      bVar3 = AABB::intersect(queryAabb,(AABB *)(puVar2 + (ulong)uVar8 * 0x24));
      if (bVar3) {
        local_138[uVar4] = uVar8;
        local_150 = uVar4;
      }
      uVar5 = iVar1 + uVar5;
      if ((this->m_nodes).m_base.size <= uVar5) goto LAB_001aba57;
      bVar3 = AABB::intersect(queryAabb,
                              (AABB *)((this->m_nodes).m_base.buffer + (ulong)uVar5 * 0x24));
      if (bVar3) {
        local_150 = (ulong)((int)local_150 + 1);
        local_138[local_150] = uVar5;
      }
    }
    uVar4 = local_150;
    if ((int)local_150 < 0) {
      return;
    }
  } while( true );
}

Assistant:

void query(const AABB &queryAabb, Array<uint32_t> &result) const
	{
		result.clear();
		// Working set
		uint32_t todo[64];
		int32_t stackptr = 0;
		// "Push" on the root node to the working set
		todo[stackptr] = 0;
		while(stackptr >= 0) {
			// Pop off the next node to work on.
			const int ni = todo[stackptr--];
			const Node &node = m_nodes[ni];
			// Is leaf -> Intersect
			if (node.rightOffset == 0) {
				for(uint32_t o = 0; o < node.nPrims; ++o) {
					const uint32_t obj = node.start + o;
					if (queryAabb.intersect((*m_objectAabbs)[m_objectIds[obj]]))
						result.push_back(m_objectIds[obj]);
				}
			} else { // Not a leaf
				const uint32_t left = ni + 1;
				const uint32_t right = ni + node.rightOffset;
				if (queryAabb.intersect(m_nodes[left].aabb))
					todo[++stackptr] = left;
				if (queryAabb.intersect(m_nodes[right].aabb))
					todo[++stackptr] = right;
			}
		}
	}